

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionEntryPointInfo::Invalidate(FunctionEntryPointInfo *this,bool prolongEntryPoint)

{
  FunctionBody *this_00;
  undefined8 *puVar1;
  int *piVar2;
  ScriptFunctionType *pSVar3;
  code *pcVar4;
  AutoCleanup oldEntryPointInfo;
  bool bVar5;
  State SVar6;
  undefined4 *puVar7;
  FunctionEntryPointInfo *pFVar8;
  void *pvVar9;
  JavascriptMethod p_Var10;
  FunctionProxy *pFVar11;
  FunctionProxy *pFVar12;
  long lVar13;
  AutoCleanup local_58;
  AutoCleanup autoCleanup;
  FunctionEntryPointInfo *local_38;
  
  pFVar12 = (this->functionProxy).ptr;
  if ((pFVar12->functionInfo).ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4f1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_0077f85e;
    *puVar7 = 0;
  }
  if ((((pFVar12->functionInfo).ptr)->functionBodyImpl).ptr != pFVar12) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4f2,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar5) goto LAB_0077f85e;
    *puVar7 = 0;
  }
  if ((((pFVar12->functionInfo).ptr)->attributes & (DeferredParse|DeferredDeserialize)) != None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2431,"(!this->functionProxy->IsDeferred())",
                                "!this->functionProxy->IsDeferred()");
    if (!bVar5) goto LAB_0077f85e;
    *puVar7 = 0;
  }
  this_00 = (FunctionBody *)(this->functionProxy).ptr;
  bVar5 = FunctionProxy::IsFunctionBody((FunctionProxy *)this_00);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (!bVar5) goto LAB_0077f85e;
    *puVar7 = 0;
  }
  pFVar8 = (FunctionEntryPointInfo *)
           FunctionProxy::GetAuxPtr((FunctionProxy *)this_00,SimpleJitEntryPointInfo);
  if (pFVar8 == this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2433,"(this != functionBody->GetSimpleJitEntryPointInfo())",
                                "this != functionBody->GetSimpleJitEntryPointInfo()");
    if (!bVar5) goto LAB_0077f85e;
    *puVar7 = 0;
  }
  EntryPointInfo::FreeJitTransferData(&this->super_EntryPointInfo);
  local_38 = FunctionBody::GetDefaultFunctionEntryPointInfo(this_00);
  SVar6 = EntryPointInfo::GetState(&local_38->super_EntryPointInfo);
  if (SVar6 == CodeGenPending) {
    Output::Trace(LazyBailoutPhase,L"Skipping creating new entrypoint as one is already pending\n");
  }
  else {
    local_58.entryPointInfo = &this->super_EntryPointInfo;
    local_38 = FunctionBody::CreateNewDefaultEntryPoint(this_00);
    GenerateFunction(((this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     nativeCodeGen,this_00,(ScriptFunction *)0x0);
    local_58.entryPointInfo = (EntryPointInfo *)0x0;
    Invalidate::AutoCleanup::~AutoCleanup(&local_58);
  }
  pFVar12 = (this->functionProxy).ptr;
  autoCleanup.entryPointInfo = &this->super_EntryPointInfo;
  pvVar9 = FunctionProxy::GetAuxPtr(pFVar12,FunctionObjectTypeList);
  if ((pvVar9 != (void *)0x0) && (0 < *(int *)((long)pvVar9 + 0x10))) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    lVar13 = 0;
    do {
      puVar1 = *(undefined8 **)(*(long *)((long)pvVar9 + 8) + lVar13 * 8);
      if ((((ulong)puVar1 & 1) == 0 && puVar1 != (undefined8 *)0x0) &&
         (piVar2 = (int *)*puVar1, piVar2 != (int *)0x0)) {
        if (*piVar2 != 0x1b) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                      ,0x245d,"(functionType->GetTypeId() == TypeIds_Function)",
                                      "functionType->GetTypeId() == TypeIds_Function");
          if (!bVar5) goto LAB_0077f85e;
          *puVar7 = 0;
        }
        if (*(EntryPointInfo **)(piVar2 + 0xe) == autoCleanup.entryPointInfo) {
          pFVar11 = (FunctionProxy *)(piVar2 + 0xe);
          Memory::Recycler::WBSetBit((char *)pFVar11);
          *(FunctionEntryPointInfo **)(piVar2 + 0xe) = local_38;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(pFVar11);
          p_Var10 = FunctionProxy::GetDirectEntryPoint(pFVar11,(ProxyEntryPointInfo *)local_38);
          *(JavascriptMethod *)(piVar2 + 6) = p_Var10;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < *(int *)((long)pvVar9 + 0x10));
  }
  oldEntryPointInfo.entryPointInfo = autoCleanup.entryPointInfo;
  pSVar3 = (pFVar12->deferredPrototypeType).ptr;
  if (pSVar3 != (ScriptFunctionType *)0x0) {
    if ((pSVar3->super_DynamicType).super_Type.typeId != TypeIds_Function) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x245d,"(functionType->GetTypeId() == TypeIds_Function)",
                                  "functionType->GetTypeId() == TypeIds_Function");
      if (!bVar5) goto LAB_0077f85e;
      *puVar7 = 0;
    }
    if ((EntryPointInfo *)(pSVar3->entryPointInfo).ptr == oldEntryPointInfo.entryPointInfo) {
      pFVar11 = (FunctionProxy *)&pSVar3->entryPointInfo;
      Memory::Recycler::WBSetBit((char *)pFVar11);
      (pSVar3->entryPointInfo).ptr = (ProxyEntryPointInfo *)local_38;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pFVar11);
      p_Var10 = FunctionProxy::GetDirectEntryPoint(pFVar11,(ProxyEntryPointInfo *)local_38);
      (pSVar3->super_DynamicType).super_Type.entryPoint = (Type)p_Var10;
    }
  }
  pSVar3 = (pFVar12->undeferredFunctionType).ptr;
  if (pSVar3 != (ScriptFunctionType *)0x0) {
    if ((pSVar3->super_DynamicType).super_Type.typeId != TypeIds_Function) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x245d,"(functionType->GetTypeId() == TypeIds_Function)",
                                  "functionType->GetTypeId() == TypeIds_Function");
      if (!bVar5) {
LAB_0077f85e:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
    }
    if ((EntryPointInfo *)(pSVar3->entryPointInfo).ptr == oldEntryPointInfo.entryPointInfo) {
      pFVar12 = (FunctionProxy *)&pSVar3->entryPointInfo;
      Memory::Recycler::WBSetBit((char *)pFVar12);
      (pSVar3->entryPointInfo).ptr = (ProxyEntryPointInfo *)local_38;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pFVar12);
      p_Var10 = FunctionProxy::GetDirectEntryPoint(pFVar12,(ProxyEntryPointInfo *)local_38);
      (pSVar3->super_DynamicType).super_Type.entryPoint = (Type)p_Var10;
    }
  }
  if (prolongEntryPoint) {
    return;
  }
  ThreadContext::QueueFreeOldEntryPointInfoIfInScript
            (*(ThreadContext **)
              (oldEntryPointInfo.entryPointInfo[1].super_ProxyEntryPointInfo.super_ExpirableObject.
               super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[3]
              + 0x3b8),(FunctionEntryPointInfo *)oldEntryPointInfo.entryPointInfo);
  return;
}

Assistant:

void FunctionEntryPointInfo::Invalidate(bool prolongEntryPoint)
    {
        Assert(!this->functionProxy->IsDeferred());
        FunctionBody* functionBody = this->functionProxy->GetFunctionBody();
        Assert(this != functionBody->GetSimpleJitEntryPointInfo());

        // We may have got here following OOM in ProcessJitTransferData. Free any data we have
        // to reduce the chance of another OOM below.
        this->FreeJitTransferData();

        FunctionEntryPointInfo* entryPoint = functionBody->GetDefaultFunctionEntryPointInfo();
        if (entryPoint->IsCodeGenPending())
        {
            OUTPUT_TRACE(Js::LazyBailoutPhase, _u("Skipping creating new entrypoint as one is already pending\n"));
        }
        else
        {
            class AutoCleanup
            {
                EntryPointInfo *entryPointInfo;
            public:
                AutoCleanup(EntryPointInfo *entryPointInfo) : entryPointInfo(entryPointInfo)
                {
                }

                void Done()
                {
                    entryPointInfo = nullptr;
                }
                ~AutoCleanup()
                {
                    if (entryPointInfo)
                    {
                        entryPointInfo->ResetOnLazyBailoutFailure();
                    }
                }
            } autoCleanup(this);

            entryPoint = functionBody->CreateNewDefaultEntryPoint();

            GenerateFunction(functionBody->GetScriptContext()->GetNativeCodeGenerator(), functionBody, /*function*/ nullptr);
            autoCleanup.Done();

        }
        this->functionProxy->MapFunctionObjectTypes([&](ScriptFunctionType* functionType)
        {
            Assert(functionType->GetTypeId() == TypeIds_Function);

            if (functionType->GetEntryPointInfo() == this)
            {
                functionType->SetEntryPointInfo(entryPoint);
                functionType->SetEntryPoint(this->functionProxy->GetDirectEntryPoint(entryPoint));
            }
        });
        if (!prolongEntryPoint)
        {
            ThreadContext* threadContext = this->functionProxy->GetScriptContext()->GetThreadContext();
            threadContext->QueueFreeOldEntryPointInfoIfInScript(this);
        }
    }